

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc.cpp
# Opt level: O2

path * __thiscall
Process::Normalise(path *__return_storage_ptr__,Process *this,int fd,path *path,path *cwd)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  string *psVar4;
  path fullPath;
  error_code ec;
  path canonical;
  path parent;
  path canonicalParent;
  path file;
  path local_e0;
  error_code local_c0;
  path local_b0;
  path local_90;
  path local_70;
  path local_50;
  
  local_c0.val_ = 0;
  local_c0.failed_ = false;
  local_c0.cat_ =
       &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  paVar2 = &local_e0.m_pathname.field_2;
  local_e0.m_pathname._M_string_length = 0;
  local_e0.m_pathname.field_2._M_local_buf[0] = '\0';
  local_e0.m_pathname._M_dataplus._M_p = (pointer)paVar2;
  bVar3 = boost::filesystem::path::is_relative(path);
  if (bVar3) {
    if (fd != -100) {
      GetFd(&local_90,this,fd);
      boost::filesystem::operator/(&local_b0,&local_90,path);
      psVar4 = (string *)boost::filesystem::path::normalize(&local_b0);
      std::__cxx11::string::string((string *)__return_storage_ptr__,psVar4);
      std::__cxx11::string::~string((string *)&local_b0);
      psVar4 = (string *)&local_90;
      goto LAB_00108c7a;
    }
    boost::filesystem::operator/(&local_b0,cwd,path);
    boost::filesystem::path::normalize(&local_b0);
    std::__cxx11::string::_M_assign((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  else {
    std::__cxx11::string::_M_assign((string *)&local_e0);
  }
  boost::filesystem::canonical(&local_b0,&local_e0,&local_c0);
  if (local_c0.failed_ == false) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&local_b0);
  }
  else {
    boost::filesystem::path::parent_path();
    boost::filesystem::path::filename();
    boost::filesystem::canonical(&local_70,&local_90,&local_c0);
    if (local_c0.failed_ == false) {
      boost::filesystem::operator/(__return_storage_ptr__,&local_70,&local_50);
    }
    else {
      paVar1 = &(__return_storage_ptr__->m_pathname).field_2;
      (__return_storage_ptr__->m_pathname)._M_dataplus._M_p = (pointer)paVar1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0.m_pathname._M_dataplus._M_p == paVar2) {
        paVar1->_M_allocated_capacity =
             CONCAT71(local_e0.m_pathname.field_2._M_allocated_capacity._1_7_,
                      local_e0.m_pathname.field_2._M_local_buf[0]);
        *(undefined8 *)((long)&(__return_storage_ptr__->m_pathname).field_2 + 8) =
             local_e0.m_pathname.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->m_pathname)._M_dataplus._M_p = local_e0.m_pathname._M_dataplus._M_p
        ;
        (__return_storage_ptr__->m_pathname).field_2._M_allocated_capacity =
             CONCAT71(local_e0.m_pathname.field_2._M_allocated_capacity._1_7_,
                      local_e0.m_pathname.field_2._M_local_buf[0]);
      }
      (__return_storage_ptr__->m_pathname)._M_string_length = local_e0.m_pathname._M_string_length;
      local_e0.m_pathname._M_string_length = 0;
      local_e0.m_pathname.field_2._M_local_buf[0] = '\0';
      local_e0.m_pathname._M_dataplus._M_p = (pointer)paVar2;
    }
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_90);
  }
  psVar4 = (string *)&local_b0;
LAB_00108c7a:
  std::__cxx11::string::~string(psVar4);
  std::__cxx11::string::~string((string *)&local_e0);
  return __return_storage_ptr__;
}

Assistant:

fs::path Process::Normalise(int fd, const fs::path &path, const fs::path &cwd)
{
  boost::system::error_code ec;

  // Get rid of the relative path.
  fs::path fullPath;
  if (path.is_relative()) {
    if (fd == AT_FDCWD) {
      fullPath = (cwd / path).normalize();
    } else {
      return (GetFd(fd) / path).normalize();
    }
  } else {
    fullPath = path;
  }

  // If the file exists, return the canonical path.
  const fs::path canonical = fs::canonical(fullPath, ec);
  if (!ec) {
    return canonical;
  }

  // If the file was deleted, try to canonicalise the parent.
  const fs::path parent = fullPath.parent_path();
  const fs::path file = fullPath.filename();

  const fs::path canonicalParent = fs::canonical(parent, ec);
  if (!ec) {
    return canonicalParent / file;
  }

  return fullPath;
}